

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Auxiliary.cpp
# Opt level: O0

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* tokenize(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,string *input_string)

{
  bool bVar1;
  _Ios_Openmode _Var2;
  istream *piVar3;
  stringstream local_1c0 [8];
  stringstream ss;
  undefined1 local_38 [8];
  string buf;
  string *input_string_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokens;
  
  buf.field_2._8_8_ = input_string;
  std::__cxx11::string::string((string *)local_38);
  _Var2 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream(local_1c0,(string *)input_string,_Var2);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__);
  while( true ) {
    piVar3 = std::operator>>((istream *)local_1c0,(string *)local_38);
    bVar1 = std::ios::operator_cast_to_bool((ios *)(piVar3 + *(long *)(*(long *)piVar3 + -0x18)));
    if (!bVar1) break;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_38);
  }
  std::__cxx11::stringstream::~stringstream(local_1c0);
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::vector<string> tokenize(std::string input_string) {

   string buf;
   stringstream ss(input_string);
   std::vector<string> tokens;

   while (ss >> buf)
      tokens.push_back(buf);

   return tokens;
}